

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall cfd::core::Serializer::AddVariableInt(Serializer *this,uint64_t value)

{
  pointer puVar1;
  int iVar2;
  ulong uVar3;
  
  CheckNeedSize(this,9);
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar3 = (ulong)this->offset_;
  if (value < 0xfd) {
    puVar1[uVar3] = (uchar)value;
    iVar2 = 1;
  }
  else if (value < 0x10000) {
    puVar1[uVar3] = 0xfd;
    *(short *)(puVar1 + uVar3 + 1) = (short)value;
    iVar2 = 3;
  }
  else if (value >> 0x20 == 0) {
    puVar1[uVar3] = 0xfe;
    *(int *)(puVar1 + uVar3 + 1) = (int)value;
    iVar2 = 5;
  }
  else {
    puVar1[uVar3] = 0xff;
    *(uint64_t *)(puVar1 + uVar3 + 1) = value;
    iVar2 = 9;
  }
  this->offset_ = this->offset_ + iVar2;
  return;
}

Assistant:

void Serializer::AddVariableInt(uint64_t value) {
  // TODO(k-matsuzawa) need endian support.
  CheckNeedSize(9);
  uint8_t* buf = &buffer_.data()[offset_];
  if (value <= kViMax8) {
    *buf = static_cast<uint8_t>(value);
    ++offset_;
  } else if (value <= std::numeric_limits<uint16_t>::max()) {
    *buf = kViTag16;
    ++buf;
    uint16_t v16 = static_cast<uint16_t>(value);
    memcpy(buf, &v16, sizeof(v16));
    offset_ += sizeof(v16) + 1;
  } else if (value <= std::numeric_limits<uint32_t>::max()) {
    *buf = kViTag32;
    ++buf;
    uint32_t v32 = static_cast<uint32_t>(value);
    memcpy(buf, &v32, sizeof(v32));
    offset_ += sizeof(v32) + 1;
  } else {
    *buf = kViTag64;
    ++buf;
    uint64_t v64 = value;
    memcpy(buf, &v64, sizeof(v64));
    offset_ += sizeof(v64) + 1;
  }
}